

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O3

int32_t icu_63::PluralFormat::findSubMessage
                  (MessagePattern *pattern,int32_t partIndex,PluralSelector *selector,void *context,
                  double number,UErrorCode *ec)

{
  int iVar1;
  UBool UVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int srcLength;
  Part *pPVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  UnicodeString keyword;
  UnicodeString other;
  double local_140;
  ConstChar16Ptr local_128;
  double local_120;
  PluralSelector *local_118;
  void *local_110;
  UErrorCode *local_108;
  char16_t *local_100;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  iVar9 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = pattern->partsLength;
    local_110 = context;
    local_108 = ec;
    if ((pattern->parts[partIndex].type & ~UMSGPAT_PART_TYPE_MSG_LIMIT) == UMSGPAT_PART_TYPE_ARG_INT
       ) {
      local_140 = MessagePattern::getNumericValue(pattern,pattern->parts + partIndex);
      partIndex = partIndex + 1;
    }
    else {
      local_140 = 0.0;
    }
    local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
    local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_128.p_ = (char16_t *)OTHER_STRING;
    local_118 = selector;
    icu_63::UnicodeString::UnicodeString(&local_b0,'\0',&local_128,5);
    local_100 = local_128.p_;
    local_120 = number - local_140;
    pPVar8 = pattern->parts;
    bVar11 = false;
    iVar6 = 0;
    do {
      iVar9 = iVar6;
      if (pPVar8[partIndex].type == UMSGPAT_PART_TYPE_ARG_LIMIT) break;
      iVar9 = partIndex + 1;
      lVar10 = (long)iVar9;
      if ((pPVar8[lVar10].type & ~UMSGPAT_PART_TYPE_MSG_LIMIT) == UMSGPAT_PART_TYPE_ARG_INT) {
        dVar12 = MessagePattern::getNumericValue(pattern,pPVar8 + lVar10);
        iVar9 = partIndex + 2;
        if ((dVar12 == number) && (!NAN(dVar12) && !NAN(number))) break;
        lVar10 = (long)iVar9;
      }
      else if (bVar11) {
LAB_002b5f21:
        bVar11 = true;
      }
      else {
        UVar2 = MessagePattern::partSubstringMatches(pattern,pPVar8 + partIndex,&local_b0);
        if (UVar2 == '\0') {
          if ((ushort)local_f0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
            (*local_118->_vptr_PluralSelector[2])(local_120,&local_70,local_118,local_110,local_108)
            ;
            icu_63::UnicodeString::moveFrom(&local_f0,&local_70);
            icu_63::UnicodeString::~UnicodeString(&local_70);
            if (iVar6 != 0) {
              if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
                uVar4 = local_b0.fUnion.fFields.fLength;
                if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
                  uVar4 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                iVar7 = 0;
                if ((int)uVar4 < 0) {
                  iVar7 = uVar4;
                }
                srcLength = uVar4 - iVar7;
                if ((int)uVar4 <= uVar4 - iVar7) {
                  srcLength = uVar4;
                }
                if ((int)uVar4 < 0) {
                  srcLength = 0;
                }
                uVar4 = local_f0.fUnion.fFields.fLength;
                if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
                  uVar4 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                uVar5 = local_b0.fUnion.fStackFields.fBuffer;
                if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                  uVar5 = local_b0.fUnion.fFields.fArray;
                }
                bVar3 = icu_63::UnicodeString::doCompare
                                  (&local_f0,0,uVar4,(UChar *)uVar5,iVar7,srcLength);
              }
              else {
                bVar3 = ~(byte)local_f0.fUnion.fStackFields.fLengthAndFlags & 1;
              }
              if (bVar3 == 0) goto LAB_002b5f21;
            }
          }
          UVar2 = MessagePattern::partSubstringMatches(pattern,pPVar8 + partIndex,&local_f0);
          bVar11 = UVar2 != '\0';
          if (bVar11) {
            iVar6 = iVar9;
          }
        }
        else if (iVar6 == 0) {
          if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
            uVar4 = local_b0.fUnion.fFields.fLength;
            if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
              uVar4 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            iVar6 = 0;
            if ((int)uVar4 < 0) {
              iVar6 = uVar4;
            }
            iVar7 = uVar4 - iVar6;
            if ((int)uVar4 <= uVar4 - iVar6) {
              iVar7 = uVar4;
            }
            if ((int)uVar4 < 0) {
              iVar7 = 0;
            }
            uVar4 = local_f0.fUnion.fFields.fLength;
            if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
              uVar4 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            uVar5 = local_b0.fUnion.fStackFields.fBuffer;
            if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
              uVar5 = local_b0.fUnion.fFields.fArray;
            }
            bVar3 = icu_63::UnicodeString::doCompare(&local_f0,0,uVar4,(UChar *)uVar5,iVar6,iVar7);
          }
          else {
            bVar3 = ~(byte)local_f0.fUnion.fStackFields.fLengthAndFlags & 1;
          }
          bVar11 = bVar3 == 0;
          iVar6 = iVar9;
        }
        else {
          bVar11 = false;
        }
      }
      pPVar8 = pattern->parts;
      if (iVar9 < pPVar8[lVar10].limitPartIndex) {
        iVar9 = pPVar8[lVar10].limitPartIndex;
      }
      partIndex = iVar9 + 1;
      iVar9 = iVar6;
    } while (partIndex < iVar1);
    icu_63::UnicodeString::~UnicodeString(&local_b0);
    icu_63::UnicodeString::~UnicodeString(&local_f0);
  }
  return iVar9;
}

Assistant:

int32_t PluralFormat::findSubMessage(const MessagePattern& pattern, int32_t partIndex,
                                     const PluralSelector& selector, void *context,
                                     double number, UErrorCode& ec) {
    if (U_FAILURE(ec)) {
        return 0;
    }
    int32_t count=pattern.countParts();
    double offset;
    const MessagePattern::Part* part=&pattern.getPart(partIndex);
    if (MessagePattern::Part::hasNumericValue(part->getType())) {
        offset=pattern.getNumericValue(*part);
        ++partIndex;
    } else {
        offset=0;
    }
    // The keyword is empty until we need to match against a non-explicit, not-"other" value.
    // Then we get the keyword from the selector.
    // (In other words, we never call the selector if we match against an explicit value,
    // or if the only non-explicit keyword is "other".)
    UnicodeString keyword;
    UnicodeString other(FALSE, OTHER_STRING, 5);
    // When we find a match, we set msgStart>0 and also set this boolean to true
    // to avoid matching the keyword again (duplicates are allowed)
    // while we continue to look for an explicit-value match.
    UBool haveKeywordMatch=FALSE;
    // msgStart is 0 until we find any appropriate sub-message.
    // We remember the first "other" sub-message if we have not seen any
    // appropriate sub-message before.
    // We remember the first matching-keyword sub-message if we have not seen
    // one of those before.
    // (The parser allows [does not check for] duplicate keywords.
    // We just have to make sure to take the first one.)
    // We avoid matching the keyword twice by also setting haveKeywordMatch=true
    // at the first keyword match.
    // We keep going until we find an explicit-value match or reach the end of the plural style.
    int32_t msgStart=0;
    // Iterate over (ARG_SELECTOR [ARG_INT|ARG_DOUBLE] message) tuples
    // until ARG_LIMIT or end of plural-only pattern.
    do {
        part=&pattern.getPart(partIndex++);
        const UMessagePatternPartType type = part->getType();
        if(type==UMSGPAT_PART_TYPE_ARG_LIMIT) {
            break;
        }
        U_ASSERT (type==UMSGPAT_PART_TYPE_ARG_SELECTOR);
        // part is an ARG_SELECTOR followed by an optional explicit value, and then a message
        if(MessagePattern::Part::hasNumericValue(pattern.getPartType(partIndex))) {
            // explicit value like "=2"
            part=&pattern.getPart(partIndex++);
            if(number==pattern.getNumericValue(*part)) {
                // matches explicit value
                return partIndex;
            }
        } else if(!haveKeywordMatch) {
            // plural keyword like "few" or "other"
            // Compare "other" first and call the selector if this is not "other".
            if(pattern.partSubstringMatches(*part, other)) {
                if(msgStart==0) {
                    msgStart=partIndex;
                    if(0 == keyword.compare(other)) {
                        // This is the first "other" sub-message,
                        // and the selected keyword is also "other".
                        // Do not match "other" again.
                        haveKeywordMatch=TRUE;
                    }
                }
            } else {
                if(keyword.isEmpty()) {
                    keyword=selector.select(context, number-offset, ec);
                    if(msgStart!=0 && (0 == keyword.compare(other))) {
                        // We have already seen an "other" sub-message.
                        // Do not match "other" again.
                        haveKeywordMatch=TRUE;
                        // Skip keyword matching but do getLimitPartIndex().
                    }
                }
                if(!haveKeywordMatch && pattern.partSubstringMatches(*part, keyword)) {
                    // keyword matches
                    msgStart=partIndex;
                    // Do not match this keyword again.
                    haveKeywordMatch=TRUE;
                }
            }
        }
        partIndex=pattern.getLimitPartIndex(partIndex);
    } while(++partIndex<count);
    return msgStart;
}